

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestInvoker *_testCase,string *_className,
                   NameAndTags *nameAndTags,SourceLineInfo *_lineInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  undefined1 *puVar3;
  SpecialProperties SVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  string *psVar8;
  bool bVar9;
  string tag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string _descOrTags;
  string desc;
  TestCaseInfo info;
  string local_1b0;
  SourceLineInfo *local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  TestCase *local_168;
  ITestInvoker *local_160;
  string *local_158;
  NameAndTags *local_150;
  string local_148;
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  string local_108;
  ReusableStringStream local_e8;
  TestCaseInfo local_d8;
  
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  pcVar2 = (nameAndTags->tags).m_start;
  local_128 = local_118;
  local_190 = _lineInfo;
  local_160 = _testCase;
  local_158 = _className;
  local_150 = nameAndTags;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,pcVar2,pcVar2 + (nameAndTags->tags).m_size);
  puVar3 = local_128;
  if (local_120 != 0) {
    lVar6 = 0;
    bVar9 = false;
    bVar7 = false;
    local_168 = __return_storage_ptr__;
    do {
      if (bVar7) {
        psVar8 = &local_1b0;
        if (puVar3[lVar6] == ']') {
          SVar4 = anon_unknown_1::parseSpecialTag(&local_1b0);
          bVar7 = true;
          if (((((SVar4 & IsHidden) == None) && (bVar7 = bVar9, SVar4 == None)) &&
              (SVar4 = anon_unknown_1::parseSpecialTag(&local_1b0), SVar4 == None)) &&
             ((local_1b0._M_string_length != 0 &&
              (iVar5 = isalnum((uint)(byte)*local_1b0._M_dataplus._M_p), iVar5 == 0)))) {
            ReusableStringStream::ReusableStringStream(&local_e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_e8.m_oss,"Tag name: [",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_e8.m_oss,local_1b0._M_dataplus._M_p,
                       local_1b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_e8.m_oss,"] is not allowed.\n",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_e8.m_oss,
                       "Tag names starting with non alphanumeric characters are reserved\n",0x41);
            operator<<(local_e8.m_oss,local_190);
            std::__cxx11::stringbuf::str();
            std::domain_error::domain_error((domain_error *)&local_148,(string *)&local_d8);
            throw_exception<std::domain_error>((domain_error *)&local_148);
          }
          bVar9 = bVar7;
          if (((local_1b0._M_string_length != 0) && (local_1b0._M_string_length != 1)) &&
             (*local_1b0._M_dataplus._M_p == 0x2e)) {
            std::__cxx11::string::erase((ulong)&local_1b0,0);
          }
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_188,&local_1b0);
          local_1b0._M_string_length = 0;
          *local_1b0._M_dataplus._M_p = 0;
          bVar7 = false;
        }
        else {
LAB_00126382:
          std::__cxx11::string::push_back((char)psVar8);
        }
      }
      else {
        psVar8 = &local_108;
        if (puVar3[lVar6] != '[') goto LAB_00126382;
        bVar7 = true;
      }
      __return_storage_ptr__ = local_168;
      lVar6 = lVar6 + 1;
    } while (local_120 != lVar6);
    if (bVar9) {
      paVar1 = &local_d8.name.field_2;
      local_d8.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,".","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
                 &local_d8.name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8.name._M_dataplus._M_p);
      }
    }
  }
  pcVar2 = (local_150->name).m_start;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,pcVar2,pcVar2 + (local_150->name).m_size);
  TestCaseInfo::TestCaseInfo(&local_d8,&local_148,local_158,&local_108,&local_188,local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  TestCase::TestCase(__return_storage_ptr__,local_160,&local_d8);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8.lcaseTags);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8.tags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.description._M_dataplus._M_p != &local_d8.description.field_2) {
    operator_delete(local_d8.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.className._M_dataplus._M_p != &local_d8.className.field_2) {
    operator_delete(local_d8.className._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name._M_dataplus._M_p != &local_d8.name.field_2) {
    operator_delete(local_d8.name._M_dataplus._M_p);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        std::string _descOrTags = nameAndTags.tags;
        for (char c : _descOrTags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            tags.push_back( "." );
        }

        TestCaseInfo info( nameAndTags.name, _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }